

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

EventLogEntry * __thiscall
TTD::EventLog::RecordJsRTCodeParse
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,LoadScriptFlag loadFlag,
          bool isUft8,byte *script,uint32 scriptByteLength,uint64 sourceContextId,char16 *sourceUri)

{
  EventLogEntry *actionEvent;
  uchar *puVar1;
  EventLogEntry *evt;
  JsRTCodeParseAction *cpAction;
  byte *pbStack_28;
  uint32 scriptByteLength_local;
  byte *script_local;
  bool isUft8_local;
  TTDJsRTActionResultAutoRecorder *pTStack_18;
  LoadScriptFlag loadFlag_local;
  TTDJsRTActionResultAutoRecorder *actionPopper_local;
  EventLog *this_local;
  
  evt = (EventLogEntry *)0x0;
  cpAction._4_4_ = scriptByteLength;
  pbStack_28 = script;
  script_local._3_1_ = isUft8;
  script_local._4_4_ = loadFlag;
  pTStack_18 = actionPopper;
  actionPopper_local = (TTDJsRTActionResultAutoRecorder *)this;
  actionEvent = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTCodeParseAction,(TTD::NSLogEvents::EventKind)67>
                          (this,(JsRTCodeParseAction **)&evt);
  *(undefined4 *)&evt->EventTimeStamp = 0;
  *(byte *)((long)&evt->EventTimeStamp + 4) = script_local._3_1_ & 1;
  *(uint32 *)&evt[1].EventTimeStamp = cpAction._4_4_;
  puVar1 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_char>
                     (&this->m_eventSlabAllocator,(ulong)(uint)evt[1].EventTimeStamp);
  *(uchar **)(evt + 1) = puVar1;
  js_memcpy_s(*(void **)(evt + 1),(ulong)(uint)evt[1].EventTimeStamp,pbStack_28,
              (ulong)cpAction._4_4_);
  SlabAllocatorBase<8>::CopyNullTermStringInto
            (&this->m_eventSlabAllocator,sourceUri,(TTString *)(evt + 2));
  evt[3].EventKind = (undefined4)sourceContextId;
  evt[3].ResultStatus = sourceContextId._4_4_;
  *(LoadScriptFlag *)&evt[3].EventTimeStamp = script_local._4_4_;
  TTDJsRTActionResultAutoRecorder::InitializeWithEventAndEnterWResult
            (pTStack_18,actionEvent,(TTDVar *)evt);
  return actionEvent;
}

Assistant:

NSLogEvents::EventLogEntry* EventLog::RecordJsRTCodeParse(TTDJsRTActionResultAutoRecorder& actionPopper, LoadScriptFlag loadFlag, bool isUft8, const byte* script, uint32 scriptByteLength, uint64 sourceContextId, const char16* sourceUri)
    {
        NSLogEvents::JsRTCodeParseAction* cpAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTCodeParseAction, NSLogEvents::EventKind::CodeParseActionTag>(&cpAction);

        cpAction->BodyCtrId = 0; //initialize to known default -- should always update later or something is wrong

        cpAction->IsUtf8 = isUft8;
        cpAction->SourceByteLength = scriptByteLength;

        cpAction->SourceCode = this->m_eventSlabAllocator.SlabAllocateArray<byte>(cpAction->SourceByteLength);
        js_memcpy_s(cpAction->SourceCode, cpAction->SourceByteLength, script, scriptByteLength);

        this->m_eventSlabAllocator.CopyNullTermStringInto(sourceUri, cpAction->SourceUri);
        cpAction->SourceContextId = sourceContextId;

        cpAction->LoadFlag = loadFlag;

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(cpAction->Result));

        return evt;
    }